

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.hh
# Opt level: O0

void __thiscall tinyusdz::tydra::SkelHierarchy::~SkelHierarchy(SkelHierarchy *this)

{
  SkelHierarchy *this_local;
  
  SkelNode::~SkelNode(&this->root_node);
  ::std::__cxx11::string::~string((string *)&this->display_name);
  ::std::__cxx11::string::~string((string *)&this->abs_path);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SkelHierarchy() = default;